

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charconv.cc
# Opt level: O0

CalculatedFloat
absl::lts_20250127::anon_unknown_0::CalculatedFloatFromRawValues<float>
          (uint64_t mantissa,int exponent)

{
  CalculatedFloat CVar1;
  int local_24;
  uint64_t uStack_20;
  int exponent_local;
  uint64_t mantissa_local;
  CalculatedFloat result;
  
  CalculatedFloat::CalculatedFloat((CalculatedFloat *)&mantissa_local);
  local_24 = exponent;
  uStack_20 = mantissa;
  if (mantissa == 0x1000000) {
    uStack_20 = 0x800000;
    local_24 = exponent + 1;
  }
  if (local_24 < 0x69) {
    if (uStack_20 == 0) {
      result.mantissa._0_4_ = -99999;
    }
    else {
      result.mantissa._0_4_ = local_24;
      mantissa_local = uStack_20;
    }
  }
  else {
    result.mantissa._0_4_ = 99999;
  }
  CVar1.exponent = (int)result.mantissa;
  CVar1.mantissa = mantissa_local;
  CVar1._12_4_ = 0;
  return CVar1;
}

Assistant:

CalculatedFloat CalculatedFloatFromRawValues(uint64_t mantissa, int exponent) {
  CalculatedFloat result;
  if (mantissa == uint64_t{1} << FloatTraits<FloatType>::kTargetMantissaBits) {
    mantissa >>= 1;
    exponent += 1;
  }
  if (exponent > FloatTraits<FloatType>::kMaxExponent) {
    result.exponent = kOverflow;
  } else if (mantissa == 0) {
    result.exponent = kUnderflow;
  } else {
    result.exponent = exponent;
    result.mantissa = mantissa;
  }
  return result;
}